

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_function_pool.cpp
# Opt level: O2

int main(void)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ostream *poVar6;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar7;
  uint32_t x;
  pointer this;
  uint32_t uVar8;
  double dVar9;
  allocator_type local_71;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  frame;
  ImageTemplate<unsigned_char> local_58;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,0x780,0x438,'\x01','\x01');
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(&frame,0x3c,&local_58,&local_71);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  for (this = frame.
              super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      this != frame.
              super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; this = this + 1) {
    iVar3 = rand();
    PenguinV_Image::ImageTemplate<unsigned_char>::fill(this,(byte)iVar3 & 0xf);
    iVar3 = rand();
    if (iVar3 % 10 == 0) {
      uVar1 = this->_width;
      uVar4 = rand();
      uVar8 = this->_height;
      uVar5 = rand();
      uVar2 = this->_width;
      x = (uint32_t)((ulong)uVar4 % ((ulong)(uVar1 * 2) / 3));
      uVar4 = rand();
      uVar1 = this->_height;
      uVar8 = (uint32_t)((ulong)uVar5 % ((ulong)(uVar8 * 2) / 3));
      uVar5 = rand();
      iVar3 = rand();
      Image_Function::Fill
                (this,x,uVar8,uVar4 % (uVar2 - x),uVar5 % (uVar1 - uVar8),
                 ((byte)iVar3 & 0x7f) + 0x40);
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"----------");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,"Basic functions. Evaluating time...");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,"----------");
  std::endl<char,std::char_traits<char>>(poVar6);
  tVar7.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  basic(&frame);
  std::operator<<((ostream *)&std::cout,"Total time is ");
  dVar9 = getElapsedTime(tVar7);
  poVar6 = std::ostream::_M_insert<double>(dVar9);
  poVar6 = std::operator<<(poVar6," seconds");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<((ostream *)&std::cout,"----------");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,"Functions with thread pool support. Evaluating time...");
  poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(poVar6,"----------");
  std::endl<char,std::char_traits<char>>(poVar6);
  tVar7.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  multithreaded(&frame);
  std::operator<<((ostream *)&std::cout,"Total time is ");
  dVar9 = getElapsedTime(tVar7);
  poVar6 = std::ostream::_M_insert<double>(dVar9);
  poVar6 = std::operator<<(poVar6," seconds");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&frame);
  poVar6 = std::operator<<((ostream *)&std::cout,"Application ended correctly.");
  std::endl<char,std::char_traits<char>>(poVar6);
  return 0;
}

Assistant:

int main()
{
    try // <---- do not forget to put your code into try.. catch block!
    {
        // This example is more technical and it shows the difference in software development using
        // basic functions and using functions with thread pool support.
        // Plus it evaluates the speed of calculations between two examples.
        // Please take a note that speed as well as thread count depends on your CPU and
        // overall system so do not think that this comparison is fully accurate

        // Conditions:
        // We have 60 big images (frames) with 1920 x 1080 pixels (60 fps fullHD :) )
        // Our aim is pretty simple: we have to find some suspicious objects on frames and highlight them
        // What we need to do is:
        // 1. get a difference between two neighbour frames
        // 2. Find optimum threshold value
        // 3. Compare threshold value with known value of background
        // 4. threshold image with threshold
        // 5. put result on the map

        // Create a set of 60 frames
        std::vector < PenguinV_Image::Image > frame( 60, PenguinV_Image::Image( 1920, 1080 ) );

        for( std::vector < PenguinV_Image::Image >::iterator image = frame.begin(); image != frame.end(); ++image ) {
            // Fill background. Let's assume that background varies from 0 to 15 gray scale values
            image->fill( randomValue<uint8_t>(16u) );

            // Then add some 'suspicious' objects on some random images
            if( randomValue<int>(10) == 0 ) { // at least ~6 of 60 images would have objects
                // generate random place of object, in our case is rectangle
                const uint32_t x      = randomValue<uint32_t>(image->width()  * 2 / 3);
                const uint32_t y      = randomValue<uint32_t>(image->height() * 2 / 3);
                const uint32_t width  = randomValue<uint32_t>(image->width()  - x);
                const uint32_t height = randomValue<uint32_t>(image->height() - y);

                // fill an area with some random value what is bigger than background value
                Image_Function::Fill( *image, x, y, width, height, static_cast<uint8_t>( randomValue<uint8_t>(128u) + 64u ) );
            }
        }

        std::cout << "----------" << std::endl
            << "Basic functions. Evaluating time..." << std::endl << "----------" << std::endl;
        std::chrono::time_point < std::chrono::system_clock > startTime = std::chrono::system_clock::now();

        basic( frame );

        std::cout << "Total time is " << getElapsedTime( startTime ) << " seconds" << std::endl;

        std::cout << "----------" << std::endl
            << "Functions with thread pool support. Evaluating time..." << std::endl << "----------" << std::endl;
        startTime = std::chrono::system_clock::now();

        multithreaded( frame );

        std::cout << "Total time is " << getElapsedTime( startTime ) << " seconds" << std::endl;
    }
    catch( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << ex.what() << ". Press any button to continue." << std::endl;
        std::cin.ignore();
        return 1;
    }
    catch( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Press any button to continue." << std::endl;
        std::cin.ignore();
        return 2;
    }

    std::cout << "Application ended correctly." << std::endl;
    return 0;
}